

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::GlobalPooling3DLayerParams::SerializeWithCachedSizes
          (GlobalPooling3DLayerParams *this,CodedOutputStream *output)

{
  if (this->type_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(1,this->type_,output);
    return;
  }
  return;
}

Assistant:

void GlobalPooling3DLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.GlobalPooling3DLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.GlobalPooling3DLayerParams.GlobalPoolingType3D type = 1;
  if (this->type() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->type(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.GlobalPooling3DLayerParams)
}